

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckInternalVariables.cxx
# Opt level: O1

string * __thiscall
kws::Parser::FindInternalVariable_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  bool bVar9;
  string subphrase;
  ulong local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  Parser *local_68;
  ulong *local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar1 = &this->m_BufferNoComment;
  local_68 = this;
  local_60 = pos;
  local_58 = end;
  local_98 = std::__cxx11::string::find((char *)psVar1,0x177d56,start);
  local_70 = &__return_storage_ptr__->field_2;
  do {
    if (local_58 <= local_98) {
      *local_60 = 0xffffffffffffffff;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    sVar8 = local_98 - 1;
    if (local_98 != 0) {
      bVar5 = false;
      bVar9 = true;
      do {
        bVar2 = (psVar1->_M_dataplus)._M_p[sVar8];
        bVar7 = false;
        if (bVar2 < 0x29) {
          if (bVar2 != 9) {
            if (bVar2 == 10) goto LAB_001538df;
            if (bVar2 != 0x20) goto LAB_0015387d;
          }
          bVar7 = bVar9;
          if (bVar5) {
            bVar7 = false;
          }
        }
        else if (((bVar2 != 0x29) && (bVar2 != 0x5d)) && (bVar7 = false, bVar2 != 0x7d)) {
LAB_0015387d:
          local_90[0] = local_80;
          pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar4,pcVar4 + __return_storage_ptr__->_M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01'
                    );
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90[0]);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          bVar5 = true;
          bVar7 = true;
        }
LAB_001538df:
        bVar9 = sVar8 != 0;
        sVar8 = sVar8 - 1;
      } while ((bVar9) && (bVar9 = bVar7, bVar7));
    }
    *local_60 = local_98;
    if (sVar8 != 0xffffffffffffffff) {
      pcVar4 = (psVar1->_M_dataplus)._M_p;
      do {
        cVar3 = pcVar4[sVar8];
        if (cVar3 == ':') {
          if ((pcVar4[sVar8 - 1] != ':') && (pcVar4[sVar8 + 1] != ':')) goto LAB_00153936;
        }
        else if ((cVar3 == ';') || (cVar3 == '}')) goto LAB_00153936;
        bVar9 = sVar8 != 0;
        sVar8 = sVar8 - 1;
      } while (bVar9);
      sVar8 = 0xffffffffffffffff;
    }
LAB_00153936:
    if ((psVar1->_M_dataplus)._M_p[sVar8] == '}') {
      sVar8 = FindOpeningChar(local_68,'}','{',sVar8,true);
      if (sVar8 != 0) {
        do {
          if ((psVar1->_M_dataplus)._M_p[sVar8] == ';') break;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
      }
      std::__cxx11::string::substr((ulong)local_90,(ulong)psVar1);
      lVar6 = std::__cxx11::string::find((char *)local_90,0x178518,0);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      bVar9 = true;
      if (lVar6 == -1) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)psVar1);
        lVar6 = std::__cxx11::string::find((char *)local_90,0x17840b,0);
        bVar9 = lVar6 != -1;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
      }
    }
    else {
      bVar9 = false;
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)local_90,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    lVar6 = std::__cxx11::string::find((char *)local_90,0x178ab9,0);
    if (((((((lVar6 != -1) ||
            (lVar6 = std::__cxx11::string::find((char *)local_90,0x177d62,0), lVar6 != -1)) ||
           (lVar6 = std::__cxx11::string::find((char *)local_90,0x17840b,0), lVar6 != -1)) ||
          ((lVar6 = std::__cxx11::string::find((char *)local_90,0x16f702,0), lVar6 != -1 ||
           (lVar6 = std::__cxx11::string::find((char *)local_90,0x1787fc,0), lVar6 != -1)))) ||
         ((lVar6 = std::__cxx11::string::find((char *)local_90,0x178926,0), lVar6 != -1 ||
          ((lVar6 = std::__cxx11::string::find((char *)local_90,0x178522,0), lVar6 != -1 ||
           (lVar6 = std::__cxx11::string::find((char *)local_90,0x178803,0), lVar6 != -1)))))) ||
        (lVar6 = std::__cxx11::string::find((char *)local_90,0x1796fb,0), lVar6 != -1)) ||
       ((lVar6 = std::__cxx11::string::find((char *)local_90,0x178497,0), bVar9 || lVar6 != -1 ||
        (bVar9 = IsInFunction(local_68,local_98,(char *)0x0), bVar9)))) {
      local_98 = std::__cxx11::string::find((char *)psVar1,0x177d56,local_98 + 1);
      bVar5 = true;
      bVar9 = false;
    }
    else {
      lVar6 = std::__cxx11::string::find_last_of
                        ((char *)__return_storage_ptr__,0x16a5ee,0xffffffffffffffff);
      bVar9 = true;
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      bVar5 = false;
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((!bVar9) &&
       (pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar4 != local_70)) {
      operator_delete(pcVar4);
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Parser::FindInternalVariable(size_t start, size_t end,size_t & pos)
{
  size_t posSemicolon = m_BufferNoComment.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    unsigned long i=static_cast<unsigned long>(posSemicolon)-1;
    bool inWord = true;
    bool first = false;
    std::string ivar = "";
    while(i != std::string::npos && inWord)
      {
      if((m_BufferNoComment[i] != ' ')
         && (m_BufferNoComment[i] != '\t')
        )
        {
        if((m_BufferNoComment[i] == '}')
          || (m_BufferNoComment[i] == ')')
          || (m_BufferNoComment[i] == ']')
          || (m_BufferNoComment[i] == '\n')
          )
          {
          inWord = false;
          }
        else
          {
          std::string store = ivar;
          ivar = m_BufferNoComment[i];
          ivar += store;
          inWord = true;
          first = true;
          }
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    pos = posSemicolon;
    // We extract the complete definition.
    // This means that we look for a '{' or '}' or '{' or ':'
    // but not '::'
    while(i != std::string::npos)
      {
      if(m_BufferNoComment[i] == ';'
        || m_BufferNoComment[i] == '}'
        )
        {
        break;
        }
      else if(m_BufferNoComment[i] == ':')
        {
        if((m_BufferNoComment[i-1] != ':') && (m_BufferNoComment[i+1] != ':'))
          {
          break;
          }
        }
      i--;
      }

    bool isenum = false;
    // If we have a '}' we check that this is not an enum definition
    // or a typedef
    if(m_BufferNoComment[i] == '}')
      {

      // Find the opening char
      size_t j = this->FindOpeningChar('}','{',i,true);
      // Find a semicolon before that
      while(j>0)
        {
        if(m_BufferNoComment[j] == ';')
          {
          break;
          }
        j--;
        }

      if(m_BufferNoComment.substr(j+1,i-j-1).find("enum") != std::string::npos)
        {
        isenum = true;
        }
      else if(m_BufferNoComment.substr(j+1,i-j-1).find("typedef") != std::string::npos)
        {
        isenum = true;
        }
     }

    std::string subphrase = "";
    subphrase = m_BufferNoComment.substr(i+1,posSemicolon-i-1);

    if( (subphrase.find("=") == std::string::npos)
      && (subphrase.find("(") == std::string::npos)
      && (subphrase.find("typedef") == std::string::npos)
      && (subphrase.find("}") == std::string::npos)
      && (subphrase.find("friend") == std::string::npos)
      && (subphrase.find("class") == std::string::npos)
      && (subphrase.find("return") == std::string::npos)
      && (subphrase.find("extern") == std::string::npos)
      && (subphrase.find("\"") == std::string::npos)
      && (subphrase.find("<<") == std::string::npos)
      && !isenum
      )
      {
      // Check that we are not inside a function(){}
      if(!this->IsInFunction(posSemicolon))
        {
        // We check if any * is present and strip
        // the work
        size_t posstar = ivar.find_last_of("*");
        if(posstar != std::string::npos)
          {
          ivar = ivar.substr(posstar+1,ivar.size()-posstar-1);
          }
        return ivar;
        }
      }
    posSemicolon = m_BufferNoComment.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}